

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setStateDesiredTrajectory
          (L2NormCost *this,
          shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
          *stateDesiredTrajectory)

{
  L2NormCostImplementation *pLVar1;
  element_type *peVar2;
  char *pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  pLVar1 = this->m_pimpl;
  if ((pLVar1->stateCost).m_valid == false) {
    pcVar3 = "The state cost portion has been deactivated, given the provided selectors.";
  }
  else {
    peVar2 = (stateDesiredTrajectory->
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      local_10._M_pi =
           (stateDesiredTrajectory->
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
        }
      }
      (pLVar1->stateCost).desiredTrajectory.
      super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pLVar1->stateCost).desiredTrajectory.
                  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&local_10);
      if (local_10._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return true;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10._M_pi);
      return true;
    }
    pcVar3 = "Empty desired trajectory pointer.";
  }
  iDynTree::reportError("L2NormCost","setStateDesiredTrajectory",pcVar3);
  return false;
}

Assistant:

bool L2NormCost::setStateDesiredTrajectory(std::shared_ptr<TimeVaryingVector> stateDesiredTrajectory)
        {
            if (!(m_pimpl->stateCost.isValid())) {
                reportError("L2NormCost", "setStateDesiredTrajectory", "The state cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (!stateDesiredTrajectory) {
                reportError("L2NormCost", "setStateDesiredTrajectory", "Empty desired trajectory pointer.");
                return false;
            }

            return m_pimpl->stateCost.setDesiredTrajectory(stateDesiredTrajectory);
        }